

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O3

string * __thiscall
rest_rpc::rpc_service::connection::remote_address_abi_cxx11_
          (string *__return_storage_ptr__,connection *this)

{
  endpoint_type endpoint;
  error_code ec;
  address local_60;
  data_union local_44;
  error_code local_28;
  
  if (this->has_closed_ != true) {
    local_28._M_value = 0;
    local_28._M_cat = (error_category *)std::_V2::system_category();
    asio::detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
              ((endpoint_type *)&local_44.base,
               (this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
               service_,&(this->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.
                         impl_.implementation_,&local_28);
    if (local_28._M_value == 0) {
      if (local_44.base.sa_family != 2) {
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = local_44.base.sa_data[6];
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = local_44.base.sa_data[7];
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = local_44.base.sa_data[8];
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = local_44.base.sa_data[9];
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = local_44.base.sa_data[10];
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = local_44.base.sa_data[0xb];
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = local_44.base.sa_data[0xc];
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = local_44.base.sa_data[0xd];
        local_60.ipv6_address_.addr_.__in6_u._8_8_ = local_44._16_8_;
        local_60.ipv6_address_.scope_id_ = local_44.v6.sin6_scope_id;
        local_44.v6.sin6_flowinfo = 0;
      }
      else {
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[0] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[1] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[2] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[3] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[4] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[5] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[6] = '\0';
        local_60.ipv6_address_.addr_.__in6_u.__u6_addr8[7] = '\0';
        local_60.ipv6_address_.addr_.__in6_u._8_8_ = 0;
        local_60.ipv6_address_.scope_id_ = 0;
      }
      local_60.type_ = (anon_enum_32)(local_44.base.sa_family != 2);
      local_60.ipv4_address_.addr_.s_addr = local_44.v4.sin_addr.s_addr;
      asio::ip::address::to_string_abi_cxx11_(__return_storage_ptr__,&local_60);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string remote_address() const {
    if (has_closed_) {
      return "";
    }

    asio::error_code ec;
    auto endpoint = socket_.remote_endpoint(ec);
    if (ec) {
      return "";
    }
    return endpoint.address().to_string();
  }